

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O2

void __thiscall
crnd::static_huffman_data_model::~static_huffman_data_model(static_huffman_data_model *this)

{
  if (this->m_pDecode_tables != (decoder_tables *)0x0) {
    crnd_delete<crnd::prefix_coding::decoder_tables>(this->m_pDecode_tables);
  }
  vector<unsigned_char>::~vector(&this->m_code_sizes);
  return;
}

Assistant:

static_huffman_data_model::~static_huffman_data_model() {
  if (m_pDecode_tables)
    crnd_delete(m_pDecode_tables);
}